

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O0

void dinf_norm_error(int nrhs,SuperMatrix *X,double *xtrue)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  double *local_60;
  double local_58;
  int local_50;
  int local_4c;
  int j;
  int i;
  double *soln_work;
  double *Xmat;
  double xnorm;
  double err;
  DNformat *Xstore;
  double *xtrue_local;
  SuperMatrix *X_local;
  int nrhs_local;
  
  piVar1 = (int *)X->Store;
  lVar2 = *(long *)(piVar1 + 2);
  for (local_50 = 0; local_50 < nrhs; local_50 = local_50 + 1) {
    lVar3 = lVar2 + (long)(local_50 * *piVar1) * 8;
    Xmat = (double *)0x0;
    xnorm = 0.0;
    for (local_4c = 0; local_4c < X->nrow; local_4c = local_4c + 1) {
      if (xnorm <= ABS(*(double *)(lVar3 + (long)local_4c * 8) - xtrue[local_4c])) {
        local_58 = ABS(*(double *)(lVar3 + (long)local_4c * 8) - xtrue[local_4c]);
      }
      else {
        local_58 = xnorm;
      }
      xnorm = local_58;
      if ((double)Xmat <= ABS(*(double *)(lVar3 + (long)local_4c * 8))) {
        local_60 = (double *)(*(ulong *)(lVar3 + (long)local_4c * 8) & 0x7fffffffffffffff);
      }
      else {
        local_60 = Xmat;
      }
      Xmat = local_60;
    }
    printf("||X - Xtrue||/||X|| = %e\n",xnorm / (double)Xmat);
  }
  return;
}

Assistant:

void dinf_norm_error(int nrhs, SuperMatrix *X, double *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    double *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}